

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O1

TemplateDictionary * anon_unknown.dwarf_4ac5::GetSectionDict(TemplateDictionary *d,char *name,int i)

{
  TemplateDictionary *pTVar1;
  int iVar2;
  undefined8 extraout_RAX;
  char *__s;
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  dicts;
  TemplateDictionaryPeer peer;
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  local_78;
  TemplateDictionaryPeer local_58;
  TemplateString local_50;
  
  local_78.
  super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __s = "";
  if (name != (char *)0x0) {
    __s = name;
  }
  local_58.dict_ = d;
  local_50.ptr_ = __s;
  local_50.length_ = strlen(__s);
  local_50.is_immutable_ = __s < &data_start && "" < __s;
  local_50.id_ = 0;
  iVar2 = ctemplate::TemplateDictionaryPeer::GetSectionDictionaries(&local_58,&local_50,&local_78);
  if (i <= iVar2) {
    pTVar1 = local_78.
             super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
             ._M_impl.super__Vector_impl_data._M_start[(uint)i];
    if (local_78.
        super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    return pTVar1;
  }
  _GLOBAL__N_1::GetSectionDict();
  if (local_78.
      super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

static const TemplateDictionary* GetSectionDict(
    const TemplateDictionary* d, const char* name, int i) {
  TemplateDictionaryPeer peer(d);
  vector<const TemplateDictionary*> dicts;
  EXPECT_GE(peer.GetSectionDictionaries(name, &dicts), i);
  return dicts[i];
}